

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu_wait_example_test.c
# Opt level: O3

void add_and_wait_mu(string_priority_queue_mu *q,nsync_time delay,int n,char **s)

{
  char *__s1;
  char **ppcVar1;
  char *__s2;
  int iVar2;
  ulong uVar3;
  long lVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  
  if (n != 0) {
    uVar3 = 0;
    do {
      __s1 = s[uVar3];
      nsync_mu_lock(&q->mu);
      iVar5 = (q->heap).h_.len_;
      a_ensure_(&q->heap,1,8);
      ppcVar1 = (q->heap).a_;
      iVar2 = (q->heap).h_.len_;
      (q->heap).h_.len_ = iVar2 + 1;
      ppcVar1[iVar2] = __s1;
      if (iVar5 == 0) {
        lVar4 = 0;
      }
      else {
        do {
          uVar7 = iVar5 - 1;
          iVar6 = (int)uVar7 >> 1;
          ppcVar1 = (q->heap).a_;
          __s2 = ppcVar1[iVar6];
          iVar2 = strcmp(__s1,__s2);
          lVar4 = (long)iVar5;
          if (-1 < iVar2) break;
          ppcVar1[iVar5] = __s2;
          lVar4 = (long)iVar6;
          iVar5 = iVar6;
        } while (1 < uVar7);
      }
      (q->heap).a_[lVar4] = __s1;
      nsync_mu_unlock(&q->mu);
      nsync_time_sleep(delay);
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

static void add_and_wait_mu (string_priority_queue_mu *q,
			     nsync_time delay, int n, const char *s[]) {
	int i;
	for (i = 0; i != n; i++) {
		string_priority_queue_mu_add (q, s[i]);
		nsync_time_sleep (delay);
	}
}